

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::addEvent<boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,scoped_ptr<bool> *args,
          shared_ptr<int> *args_1)

{
  undefined1 uVar1;
  bool bVar2;
  Queue *pQVar3;
  size_t in_stack_00000010;
  SessionWriter *in_stack_00000018;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [4];
  size_t sizes [4];
  size_t size;
  QueueWriter *in_stack_ffffffffffffff18;
  QueueWriter *ostream;
  unsigned_long *in_stack_ffffffffffffff20;
  shared_ptr<int> *in;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  QueueWriter *this_00;
  undefined1 local_88 [8];
  shared_count local_80;
  long local_78;
  char **local_70;
  long *local_68;
  long *local_60;
  long local_58 [3];
  QueueWriter local_40 [2];
  
  local_40[0]._writePos = (char *)0x0;
  local_58[0] = 8;
  local_58[1] = 8;
  local_58[2] = mserialize::serialized_size<boost::scoped_ptr<bool>>((scoped_ptr<bool> *)0x16e74a);
  this_00 = local_40;
  pQVar3 = (Queue *)mserialize::serialized_size<boost::shared_ptr<int>>((shared_ptr<int> *)0x16e778)
  ;
  this_00->_queue = pQVar3;
  local_70 = &local_40[0]._writePos;
  local_60 = local_58;
  for (local_68 = local_60; (char **)local_68 != local_70; local_68 = local_68 + 1) {
    local_78 = *local_68;
    local_40[0]._writePos = local_40[0]._writePos + local_78;
  }
  local_80.pi_ = (sp_counted_base *)(local_40[0]._writePos + 4);
  uVar1 = detail::QueueWriter::beginWrite
                    (this_00,CONCAT17(in_stack_ffffffffffffff3f,
                                      CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38))
                    );
  if (!(bool)uVar1) {
    replaceChannel(in_stack_00000018,in_stack_00000010);
    bVar2 = detail::QueueWriter::beginWrite
                      (this_00,CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                                       in_stack_ffffffffffffff38)));
    if (!bVar2) {
      return false;
    }
  }
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  in = (shared_ptr<int> *)local_88;
  mserialize::serialize<boost::scoped_ptr<bool>,binlog::detail::QueueWriter>
            ((scoped_ptr<bool> *)in,in_stack_ffffffffffffff18);
  *(undefined4 *)&in->px = 0;
  ostream = (QueueWriter *)(local_88 + 4);
  mserialize::serialize<boost::shared_ptr<int>,binlog::detail::QueueWriter>(in,ostream);
  *(undefined4 *)&ostream->_queue = 0;
  detail::QueueWriter::endWrite(this_00);
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}